

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2Consume(void)

{
  ostream *poVar1;
  bool bVar2;
  int iVar3;
  StringPiece input;
  Arg *args [1];
  string s;
  string word;
  RE2 r;
  StringPiece local_2e8;
  Arg *local_2d8;
  char *local_2d0;
  int local_2c8;
  char local_2c0 [16];
  undefined1 *local_2b0;
  undefined8 local_2a8;
  undefined1 local_2a0 [16];
  undefined1 local_290 [384];
  RE2 local_110;
  
  RE2::RE2(&local_110,"\\s*(\\w+)");
  local_2a8 = 0;
  local_2a0[0] = 0;
  local_2d0 = local_2c0;
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"   aaa b!@#$@#$cccc","");
  local_2e8.ptr_ = local_2d0;
  local_2e8.length_ = local_2c8;
  local_290._0_8_ = &local_2b0;
  local_290._8_8_ = RE2::Arg::parse_string;
  local_2d8 = (Arg *)local_290;
  bVar2 = RE2::ConsumeN(&local_2e8,&local_110,&local_2d8,1);
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xed,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: RE2::Consume(&input, r, &word)",0x2c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_2b0);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xee,3);
    poVar1 = (ostream *)(local_290 + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Check failed: (word) == (\"aaa\")",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," input: ",8);
    operator<<(poVar1,&local_2e8);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  local_290._8_8_ = RE2::Arg::parse_string;
  local_2d8 = (Arg *)local_290;
  local_290._0_8_ = &local_2b0;
  bVar2 = RE2::ConsumeN(&local_2e8,&local_110,&local_2d8,1);
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xef,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: RE2::Consume(&input, r, &word)",0x2c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_2b0);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xf0,3);
    poVar1 = (ostream *)(local_290 + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Check failed: (word) == (\"b\")",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," input: ",8);
    operator<<(poVar1,&local_2e8);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  local_290._8_8_ = RE2::Arg::parse_string;
  local_2d8 = (Arg *)local_290;
  local_290._0_8_ = &local_2b0;
  bVar2 = RE2::ConsumeN(&local_2e8,&local_110,&local_2d8,1);
  if (bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xf1,3);
    poVar1 = (ostream *)(local_290 + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Check failed: ! RE2::Consume(&input, r, &word)",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," input: ",8);
    operator<<(poVar1,&local_2e8);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  RE2::~RE2(&local_110);
  return;
}

Assistant:

TEST(RE2, Consume) {
  VLOG(1) << "TestConsume";

  RE2 r("\\s*(\\w+)");    // matches a word, possibly proceeded by whitespace
  string word;

  string s("   aaa b!@#$@#$cccc");
  StringPiece input(s);

  CHECK(RE2::Consume(&input, r, &word));
  CHECK_EQ(word, "aaa") << " input: " << input;
  CHECK(RE2::Consume(&input, r, &word));
  CHECK_EQ(word, "b") << " input: " << input;
  CHECK(! RE2::Consume(&input, r, &word)) << " input: " << input;
}